

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O3

UChar32 u_forDigit_63(int32_t digit,int8_t radix)

{
  UChar32 UVar1;
  undefined3 in_register_00000031;
  
  UVar1 = 0;
  if ((uint)digit < CONCAT31(in_register_00000031,radix) && (byte)(radix - 2U) < 0x23) {
    if (digit < 10) {
      UVar1 = digit + 0x30;
    }
    else {
      UVar1 = digit + 0x57;
    }
  }
  return UVar1;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_forDigit(int32_t digit, int8_t radix) {
    if((uint8_t)(radix-2)>(36-2) || (uint32_t)digit>=(uint32_t)radix) {
        return 0;
    } else if(digit<10) {
        return (UChar32)(0x30+digit);
    } else {
        return (UChar32)((0x61-10)+digit);
    }
}